

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O2

Operation * __thiscall dxil_spv::SPIRVModule::allocate_op(SPIRVModule *this,Op op,Id id,Id type_id)

{
  Operation *pOVar1;
  Id local_c;
  Id local_8;
  Op local_4;
  
  local_c = type_id;
  local_8 = id;
  local_4 = op;
  pOVar1 = ScratchPool<dxil_spv::Operation>::allocate<spv::Op&,unsigned_int&,unsigned_int&>
                     (&((this->impl)._M_t.
                        super___uniq_ptr_impl<dxil_spv::SPIRVModule::Impl,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_dxil_spv::SPIRVModule::Impl_*,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
                        .super__Head_base<0UL,_dxil_spv::SPIRVModule::Impl_*,_false>._M_head_impl)->
                       operation_pool,&local_4,&local_8,&local_c);
  return pOVar1;
}

Assistant:

Operation *SPIRVModule::allocate_op(spv::Op op, spv::Id id, spv::Id type_id)
{
	return impl->operation_pool.allocate(op, id, type_id);
}